

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O0

int create_string(void)

{
  code *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  char *str_x;
  int size;
  char ch;
  
  pcVar2 = create_by_char('x',10);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,10);
  poVar3 = std::operator<<(poVar3," of ");
  poVar3 = std::operator<<(poVar3,'x');
  poVar3 = std::operator<<(poVar3," is: ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"After delete: ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int create_string()
{
    using namespace std;
    const char ch = 'x';
    const int size = 10;
    const char * str_x = create_by_char(ch, size);
    //  str_x => xxxxxxxxxxxx, str 是一个 char 数组，
    //  * str_x => x, *str 是 char 数组的第一个元素的地址
    cout << size << " of " << ch << " is: " << str_x << endl;
    delete [] str_x;
    //  清掉之该地址处的值随机变化了
    cout << "After delete: " << str_x << endl;
}